

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

void __thiscall HashMap<Socket_*,_unsigned_int>::clear(HashMap<Socket_*,_unsigned_int> *this)

{
  Item *pIVar1;
  Iterator *pIVar2;
  
  pIVar2 = &this->_begin;
  while (pIVar1 = pIVar2->item, pIVar1 != &this->endItem) {
    *pIVar1->cell = (Item *)0x0;
    pIVar1->prev = this->freeItem;
    this->freeItem = pIVar1;
    pIVar2 = (Iterator *)&pIVar1->next;
  }
  (this->_begin).item = &this->endItem;
  (this->endItem).prev = (Item *)0x0;
  this->_size = 0;
  return;
}

Assistant:

void clear()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
    {
      i->~Item();
      *i->cell = 0;
      i->prev = freeItem;
      freeItem = i;
    }
    _begin.item = &endItem;
    endItem.prev = 0;
    _size = 0;
  }